

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_checksum.cpp
# Opt level: O1

uint16 crnlib::crc16(void *pBuf,size_t len,uint16 crc)

{
  uint uVar1;
  size_t sVar2;
  uint8 *p;
  uint uVar3;
  
  if (len != 0) {
    uVar1 = ~(uint)crc;
    sVar2 = 0;
    do {
      uVar3 = (uVar1 & 0xffff) >> 8 ^ (uint)*(byte *)((long)pBuf + sVar2);
      uVar3 = uVar3 >> 4 ^ uVar3;
      uVar1 = uVar3 << 0xc ^ uVar3 << 5 ^ (uVar1 << 8 | uVar3);
      sVar2 = sVar2 + 1;
    } while (len != sVar2);
    crc = ~(ushort)uVar1;
  }
  return crc;
}

Assistant:

uint16 crc16(const void* pBuf, size_t len, uint16 crc) {
  crc = ~crc;

  const uint8* p = reinterpret_cast<const uint8*>(pBuf);
  while (len) {
    const uint16 q = *p++ ^ (crc >> 8);
    crc <<= 8U;
    uint16 r = (q >> 4) ^ q;
    crc ^= r;
    r <<= 5U;
    crc ^= r;
    r <<= 7U;
    crc ^= r;
    len--;
  }

  return static_cast<uint16>(~crc);
}